

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O1

void flatbuffers::PrintVector<flatbuffers::Offset<void>>
               (Vector<flatbuffers::Offset<void>_> *v,Type type,int indent,int indent_step,
               string *_text)

{
  Vector<flatbuffers::Offset<void>_> *val;
  ulong uVar1;
  Vector<flatbuffers::Offset<void>_> *pVVar2;
  
  std::__cxx11::string::append((char *)_text);
  std::__cxx11::string::append((char *)_text);
  if (*(int *)v != 0) {
    uVar1 = 0;
    pVVar2 = v + 4;
    do {
      if (uVar1 != 0) {
        std::__cxx11::string::append((char *)_text);
        std::__cxx11::string::append((char *)_text);
      }
      std::__cxx11::string::_M_replace_aux
                ((ulong)_text,_text->_M_string_length,0,(char)(indent_step + indent));
      if ((type.base_type == BASE_TYPE_STRUCT) && ((type.struct_def)->fixed == true)) {
        val = v + 4 + (type.struct_def)->bytesize * uVar1;
      }
      else {
        if (*(uint *)v <= uVar1) {
          __assert_fail("i < Length()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/include/flatbuffers/flatbuffers.h"
                        ,0xa7,
                        "return_type flatbuffers::Vector<flatbuffers::Offset<void>>::Get(uoffset_t) const [T = flatbuffers::Offset<void>]"
                       );
        }
        val = pVVar2 + *(uint *)pVVar2;
      }
      Print<void_const*>(val,type,indent_step + indent,indent_step,(StructDef *)0x0,_text);
      uVar1 = uVar1 + 1;
      pVVar2 = pVVar2 + 4;
    } while (uVar1 < *(uint *)v);
  }
  std::__cxx11::string::append((char *)_text);
  std::__cxx11::string::_M_replace_aux((ulong)_text,_text->_M_string_length,0,(char)indent);
  std::__cxx11::string::append((char *)_text);
  return;
}

Assistant:

void PrintVector(const Vector<T> &v, Type type,
                                      int indent, int indent_step,
                                      std::string *_text) {
  std::string &text = *_text;
  text += "[";
  text += NewLine(indent_step);
  for (uoffset_t i = 0; i < v.Length(); i++) {
    if (i) {
      text += ",";
      text += NewLine(indent_step);
    }
    text.append(indent + indent_step, ' ');
    if (IsStruct(type))
      Print(v.GetStructFromOffset(i * type.struct_def->bytesize), type,
            indent + indent_step, indent_step, nullptr, _text);
    else
      Print(v.Get(i), type, indent + indent_step, indent_step, nullptr, _text);
  }
  text += NewLine(indent_step);
  text.append(indent, ' ');
  text += "]";
}